

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.hpp
# Opt level: O0

void __thiscall
Shell::Options::ChoiceOptionValue<Shell::Options::Instantiation>::output
          (ChoiceOptionValue<Shell::Options::Instantiation> *this,ostream *out,bool linewrap)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  byte in_DL;
  ostream *in_RSI;
  uint j;
  string next;
  int i;
  int count;
  string values_header;
  ostream *in_stack_ffffffffffffff00;
  ostream *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  string *__s;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint uVar7;
  string local_b8 [32];
  string local_98 [36];
  int local_74;
  int local_70;
  allocator<char> local_69;
  string local_68 [48];
  string local_38 [39];
  byte local_11;
  ostream *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  AbstractOptionValue::output
            ((AbstractOptionValue *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08,SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
  poVar3 = std::operator<<(local_10,"\tdefault: ");
  __s = local_38;
  OptionChoiceValues::operator[][abi_cxx11_
            ((OptionChoiceValues *)in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  std::operator<<(poVar3,__s);
  std::__cxx11::string::~string(local_38);
  std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(char *)__s,
             (allocator<char> *)poVar3);
  std::allocator<char>::~allocator(&local_69);
  poVar3 = std::operator<<(local_10,"\t");
  std::operator<<(poVar3,local_68);
  local_70 = 0;
  local_74 = 0;
  while( true ) {
    iVar2 = local_74;
    iVar1 = OptionChoiceValues::length((OptionChoiceValues *)0x2896c7);
    if (iVar1 <= iVar2) break;
    if (local_74 == 0) {
      in_stack_ffffffffffffff08 = local_10;
      OptionChoiceValues::operator[][abi_cxx11_
                ((OptionChoiceValues *)local_10,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      std::operator<<(in_stack_ffffffffffffff08,local_98);
      std::__cxx11::string::~string(local_98);
    }
    else {
      std::operator<<(local_10,",");
      OptionChoiceValues::operator[][abi_cxx11_
                ((OptionChoiceValues *)in_stack_ffffffffffffff08,
                 (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      if ((local_11 & 1) != 0) {
        lVar4 = std::__cxx11::string::size();
        if (0x3c < (ulong)(lVar4 + local_70)) {
          in_stack_ffffffffffffff00 =
               (ostream *)std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
          std::operator<<(in_stack_ffffffffffffff00,"\t");
          uVar7 = 0;
          while( true ) {
            uVar5 = (ulong)uVar7;
            uVar6 = std::__cxx11::string::size();
            if (uVar6 <= uVar5) break;
            std::operator<<(local_10," ");
            uVar7 = uVar7 + 1;
          }
          local_70 = 0;
        }
      }
      std::operator<<(local_10,local_b8);
      iVar2 = std::__cxx11::string::size();
      local_70 = local_70 + iVar2;
      std::__cxx11::string::~string(local_b8);
    }
    local_74 = local_74 + 1;
  }
  std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

virtual void output(std::ostream& out,bool linewrap) const {
            AbstractOptionValue::output(out,linewrap);
            out << "\tdefault: " << choices[static_cast<unsigned>(this->defaultValue)];
            out << std::endl;
            std::string values_header = "values: ";
            out << "\t" << values_header;
            // Again we restrict line length to 70 characters
            int count=0;
            for(int i=0;i<choices.length();i++){
                if(i==0){
                    out << choices[i];
                }
                else{
                    out << ",";
                    std::string next = choices[i];
                    if(linewrap && next.size()+count>60){ // next.size() will be <70, how big is a tab?
                        out << std::endl << "\t";
                        for(unsigned j=0;j<values_header.size();j++){out << " ";}
                        count = 0;
                    }
                    out << next;
                    count += next.size();
                }
            }
            out << std::endl;
        }